

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O3

int checkForBiomesAtLayer
              (LayerStack *g,Layer *entry,int *cache,uint64_t seed,int x,int z,uint w,uint h,
              BiomeFilter *filter)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  uint *__ptr;
  ulong uVar9;
  int iVar10;
  uint64_t *puVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  uint64_t *puVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  bool bVar27;
  filter_data_t fd [9];
  int local_ec;
  int local_e8;
  BiomeFilter *local_c8;
  mapfunc_t *local_c0;
  BiomeFilter *local_b8;
  mapfunc_t *local_b0;
  BiomeFilter *local_a8;
  mapfunc_t *local_a0;
  BiomeFilter *local_98;
  mapfunc_t *local_90;
  BiomeFilter *local_88;
  mapfunc_t *local_80;
  BiomeFilter *local_78;
  mapfunc_t *local_70;
  BiomeFilter *local_68;
  mapfunc_t *local_60;
  BiomeFilter *local_58;
  mapfunc_t *local_50;
  BiomeFilter *local_48;
  mapfunc_t *local_40;
  
  if ((filter->flags & 1) != 0) {
    iVar6 = entry->scale;
    iVar14 = iVar6 * x;
    iVar25 = iVar6 * z;
    iVar5 = filter->specialCnt;
    iVar24 = z >> 0x1f;
    if (0 < iVar5) {
      iVar10 = g->layers[0xe].scale;
      iVar26 = (int)(iVar6 * h + iVar25) / iVar10 - ((int)~(h + z) >> 0x1f);
      if (iVar26 < iVar25 / iVar10 + iVar24) {
        return 0;
      }
      uVar2 = g->layers[0xe].layerSalt;
      lVar12 = (seed * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * seed + uVar2;
      lVar12 = (lVar12 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar12 + uVar2;
      lVar12 = (lVar12 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar12 + uVar2;
      lVar12 = (lVar12 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar12;
      iVar23 = (int)(iVar6 * w + iVar14) / iVar10 - ((int)~(w + x) >> 0x1f);
      iVar7 = iVar14 / iVar10 + (x >> 0x1f);
      lVar22 = (long)(iVar25 / iVar10) + (long)iVar24;
      do {
        lVar20 = (long)iVar7;
        lVar17 = lVar12 * 0x5851f42d4c957f2d + 0x14057b7ef767814f + (long)iVar7 * 0x5851f42d4c957f2d
        ;
        iVar10 = (iVar23 - iVar7) + 1;
        if (iVar7 <= iVar23) {
          do {
            lVar18 = (lVar12 + lVar20) * lVar17 + lVar22;
            lVar18 = (lVar18 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar18 + lVar20;
            iVar5 = iVar5 - (uint)(((lVar18 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar18 +
                                    lVar22 >> 0x18) * 0x4ec4ec4ec4ec4ec5 + 0x9d89d89d89d89d8U <
                                  0x13b13b13b13b13b1);
            iVar10 = iVar10 + -1;
            lVar20 = lVar20 + 1;
            lVar17 = lVar17 + 0x5851f42d4c957f2d;
          } while (iVar10 != 0);
        }
        lVar22 = lVar22 + 1;
      } while (iVar26 + 1 != (int)lVar22);
      if (0 < iVar5) {
        return 0;
      }
    }
    local_e8 = iVar6 * h + iVar25;
    local_ec = iVar6 * w + iVar14;
    iVar6 = g->layers[0x15].scale;
    iVar5 = iVar14 / iVar6 + (x >> 0x1f);
    iVar24 = iVar25 / iVar6 + iVar24;
    iVar25 = local_ec / iVar6 - ((int)~(w + x) >> 0x1f);
    iVar6 = local_e8 / iVar6 - ((int)~(h + z) >> 0x1f);
    if (((uint)filter->majorToFind >> 0xe & 1) != 0) {
      if (iVar6 < iVar24) {
        return 0;
      }
      uVar2 = g->layers[0x13].layerSalt;
      lVar12 = (seed * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * seed;
      lVar22 = ((uVar2 + lVar12) * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * (uVar2 + lVar12) +
               uVar2;
      lVar22 = (lVar22 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar22 + uVar2;
      lVar22 = (lVar22 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar22;
      lVar20 = (long)iVar24;
      do {
        lVar17 = (long)iVar5;
        lVar18 = lVar22 * 0x5851f42d4c957f2d + 0x14057b7ef767814f + (long)iVar5 * 0x5851f42d4c957f2d
        ;
        iVar14 = (iVar25 - iVar5) + 1;
        if (iVar5 <= iVar25) {
          do {
            lVar21 = (lVar22 + lVar17) * lVar18 + lVar20;
            lVar21 = (lVar21 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar21 + lVar17;
            lVar21 = ((lVar21 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar21 + lVar20 >> 0x18)
                     * -0x70a3d70a3d70a3d7;
            if ((lVar21 + 0x51eb851eb851eb8U >> 2 | lVar21 << 0x3e) < 0x28f5c28f5c28f5d)
            goto LAB_00112c40;
            lVar17 = lVar17 + 1;
            lVar18 = lVar18 + 0x5851f42d4c957f2d;
            iVar14 = iVar14 + -1;
          } while (iVar14 != 0);
        }
        lVar20 = lVar20 + 1;
        if (iVar6 + 1 == (int)lVar20) {
          return 0;
        }
      } while( true );
    }
    lVar12 = (seed * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * seed;
LAB_00112c40:
    uVar9 = 0xffffffffffffffff;
    if (iVar24 <= iVar6) {
      uVar2 = g->layers[0x15].layerSalt;
      lVar12 = ((lVar12 + uVar2) * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * (lVar12 + uVar2) +
               uVar2;
      lVar12 = (lVar12 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar12 + uVar2;
      lVar12 = (lVar12 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar12;
      lVar22 = (long)iVar24;
      uVar9 = 0;
      do {
        lVar20 = (long)iVar5 * 0x5851f42d4c957f2d + 0x14057b7ef767814f + lVar12 * 0x5851f42d4c957f2d
        ;
        lVar17 = (long)iVar5;
        iVar14 = (iVar25 - iVar5) + 1;
        if (iVar5 <= iVar25) {
          do {
            lVar18 = (lVar12 + lVar17) * lVar20 + lVar22;
            lVar18 = (lVar18 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar18 + lVar17;
            lVar21 = (lVar18 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar18 + lVar22 >> 0x18;
            lVar18 = lVar21 % 6;
            lVar21 = lVar21 % 3;
            uVar9 = ((ulong)(((uint)(lVar21 >> 0x3f) & 3) + (int)lVar21 != 0) << 0x26) +
                    0x4000000000 | uVar9;
            switch(((uint)(lVar18 >> 0x3f) & 6) + (int)lVar18) {
            case 0:
              uVar9 = uVar9 | 0x14;
              break;
            case 1:
              uVar9 = uVar9 | 0x20000004;
              break;
            case 2:
              uVar9 = uVar9 | 0xc;
              break;
            case 3:
              uVar13 = 0x800000002;
              goto LAB_00112df9;
            case 4:
              uVar13 = 0x808000000;
LAB_00112df9:
              uVar9 = uVar9 | uVar13;
              break;
            case 5:
              uVar9 = uVar9 | 0x42;
            }
            iVar14 = iVar14 + -1;
            lVar20 = lVar20 + 0x5851f42d4c957f2d;
            lVar17 = lVar17 + 1;
          } while (iVar14 != 0);
        }
        lVar22 = lVar22 + 1;
      } while (iVar6 + 1 != (int)lVar22);
      uVar9 = ~uVar9;
    }
    if ((filter->majorToFind & 0xc82800005e & uVar9) != 0) {
      return 0;
    }
  }
  iVar6 = 0;
  __ptr = (uint *)cache;
  if (cache == (int *)0x0) {
    sVar8 = getMinLayerCacheSize(entry,w,h);
    iVar6 = (int)sVar8;
    __ptr = (uint *)calloc((long)iVar6,4);
  }
  uVar4 = h * w;
  if ((1 < uVar4) && (filter->biomeToExclM != 0 || filter->biomeToExcl != 0)) {
    if (iVar6 == 0) {
      sVar8 = getMinLayerCacheSize(entry,w,h);
      iVar6 = (int)sVar8;
    }
    puVar1 = &filter->biomeToExcl;
    puVar16 = &filter->biomeToExclM;
    sVar8 = getMinLayerCacheSize(entry,1,1);
    bVar27 = false;
    if ((int)sVar8 * 2 < iVar6) {
      setLayerSeed(entry,seed);
      iVar5 = (*entry->getMap)(entry,(int *)__ptr,(w >> 1) + x,(h >> 1) + z,1,1);
      if (iVar5 == 0) {
        uVar15 = *__ptr;
        puVar11 = puVar16;
        if ((int)uVar15 < 0x80) {
          puVar11 = puVar1;
        }
        uVar9 = (ulong)(byte)((char)uVar15 + 0x80);
        if ((int)uVar15 < 0x80) {
          uVar9 = (ulong)uVar15;
        }
        bVar27 = (*puVar11 >> (uVar9 & 0x3f) & 1) != 0;
      }
    }
    if ((int)sVar8 * 5 < iVar6) {
      if (bVar27) goto LAB_001125ce;
      iVar6 = (*entry->getMap)(entry,(int *)__ptr,x,z,1,1);
      if (iVar6 == 0) {
        uVar15 = *__ptr;
        puVar11 = puVar16;
        if ((int)uVar15 < 0x80) {
          puVar11 = puVar1;
        }
        uVar9 = (ulong)(byte)((char)uVar15 + 0x80);
        if ((int)uVar15 < 0x80) {
          uVar9 = (ulong)uVar15;
        }
        if ((*puVar11 >> (uVar9 & 0x3f) & 1) != 0) goto LAB_001125ce;
      }
      iVar5 = w + x + -1;
      iVar25 = (h - 1) + z;
      iVar6 = (*entry->getMap)(entry,(int *)__ptr,iVar5,iVar25,1,1);
      if (iVar6 == 0) {
        uVar15 = *__ptr;
        puVar11 = puVar16;
        if ((int)uVar15 < 0x80) {
          puVar11 = puVar1;
        }
        uVar9 = (ulong)(byte)((char)uVar15 + 0x80);
        if ((int)uVar15 < 0x80) {
          uVar9 = (ulong)uVar15;
        }
        if ((*puVar11 >> (uVar9 & 0x3f) & 1) != 0) goto LAB_001125ce;
      }
      iVar6 = (*entry->getMap)(entry,(int *)__ptr,x,iVar25,1,1);
      if (iVar6 == 0) {
        uVar15 = *__ptr;
        puVar11 = puVar16;
        if ((int)uVar15 < 0x80) {
          puVar11 = puVar1;
        }
        uVar9 = (ulong)(byte)((char)uVar15 + 0x80);
        if ((int)uVar15 < 0x80) {
          uVar9 = (ulong)uVar15;
        }
        if ((*puVar11 >> (uVar9 & 0x3f) & 1) != 0) goto LAB_001125ce;
      }
      iVar6 = (*entry->getMap)(entry,(int *)__ptr,iVar5,z,1,1);
      if (iVar6 != 0) goto LAB_00112829;
      uVar15 = *__ptr;
      if ((int)uVar15 < 0x80) {
        puVar16 = puVar1;
      }
      uVar9 = (ulong)(byte)((char)uVar15 + 0x80);
      if ((int)uVar15 < 0x80) {
        uVar9 = (ulong)uVar15;
      }
      bVar27 = (*puVar16 >> (uVar9 & 0x3f) & 1) != 0;
    }
    if (bVar27) {
LAB_001125ce:
      if (cache == (int *)0x0) {
        free(__ptr);
        return 0;
      }
      return 0;
    }
  }
LAB_00112829:
  local_c8 = filter;
  local_c0 = g->layers[0x37].getMap;
  g->layers[0x37].data = &local_c8;
  g->layers[0x37].getMap = mapFilterOceanMix;
  local_b8 = filter;
  local_b0 = g->layers[0x2f].getMap;
  g->layers[0x2f].data = &local_b8;
  g->layers[0x2f].getMap = mapFilterRiverMix;
  local_a8 = filter;
  local_a0 = g->layers[0x22].getMap;
  g->layers[0x22].data = &local_a8;
  g->layers[0x22].getMap = mapFilterShore;
  local_98 = filter;
  local_90 = g->layers[0x1e].getMap;
  g->layers[0x1e].data = &local_98;
  g->layers[0x1e].getMap = mapFilterRareBiome;
  local_88 = filter;
  local_80 = g->layers[0x19].getMap;
  g->layers[0x19].data = &local_88;
  g->layers[0x19].getMap = mapFilterBiomeEdge;
  local_78 = filter;
  local_70 = g->layers[0x30].getMap;
  g->layers[0x30].data = &local_78;
  g->layers[0x30].getMap = mapFilterOceanTemp;
  local_68 = filter;
  local_60 = g->layers[0x15].getMap;
  g->layers[0x15].data = &local_68;
  g->layers[0x15].getMap = mapFilterBiome;
  local_58 = filter;
  local_50 = g->layers[0x13].getMap;
  g->layers[0x13].data = &local_58;
  g->layers[0x13].getMap = mapFilterMushroom;
  local_48 = filter;
  local_40 = g->layers[0xe].getMap;
  g->layers[0xe].data = &local_48;
  g->layers[0xe].getMap = mapFilterSpecial;
  setLayerSeed(entry,seed);
  iVar6 = (*entry->getMap)(entry,(int *)__ptr,x,z,w,h);
  if (iVar6 == 2) {
    uVar15 = 2;
  }
  else {
    uVar15 = 0;
    if (iVar6 == 0) {
      if (uVar4 == 0) {
        uVar9 = 0;
        uVar13 = 0;
      }
      else {
        uVar19 = 0;
        uVar13 = 0;
        uVar9 = 0;
        do {
          uVar15 = __ptr[uVar19];
          if ((long)(int)uVar15 < 0x80) {
            uVar9 = uVar9 | 1L << ((long)(int)uVar15 & 0x3fU);
          }
          else {
            uVar13 = uVar13 | 1L << ((ulong)(byte)((char)uVar15 + 0x80) & 0x3f);
          }
          uVar19 = uVar19 + 1;
        } while (uVar4 != uVar19);
      }
      uVar19 = filter->biomeToFind;
      uVar3 = filter->biomeToFindM;
      uVar15 = (uint)(((((filter->biomeToPickM & uVar13) != 0 || (filter->biomeToPick & uVar9) != 0)
                       || filter->biomeToPickM == 0 && filter->biomeToPick == 0) &&
                      ((filter->biomeToExclM & uVar13) == 0 && (filter->biomeToExcl & uVar9) == 0 ||
                      filter->biomeToExclM == 0 && filter->biomeToExcl == 0)) &&
                     ((uVar13 & uVar3) == uVar3 && (uVar9 & uVar19) == uVar19 ||
                     uVar3 == 0 && uVar19 == 0));
    }
  }
  g->layers[0xe].getMap = local_40;
  g->layers[0xe].data = (void *)0x0;
  g->layers[0x13].getMap = local_50;
  g->layers[0x13].data = (void *)0x0;
  g->layers[0x15].getMap = local_60;
  g->layers[0x15].data = (void *)0x0;
  g->layers[0x30].getMap = local_70;
  g->layers[0x30].data = (void *)0x0;
  g->layers[0x19].getMap = local_80;
  g->layers[0x19].data = (void *)0x0;
  g->layers[0x1e].getMap = local_90;
  g->layers[0x1e].data = (void *)0x0;
  g->layers[0x22].getMap = local_a0;
  g->layers[0x22].data = (void *)0x0;
  g->layers[0x2f].getMap = local_b0;
  g->layers[0x2f].data = (void *)0x0;
  g->layers[0x37].getMap = local_c0;
  g->layers[0x37].data = (void *)0x0;
  if (cache == (int *)0x0) {
    free(__ptr);
    return uVar15;
  }
  return uVar15;
}

Assistant:

int checkForBiomesAtLayer(
        LayerStack        * g,
        Layer             * entry,
        int               * cache,
        uint64_t            seed,
        int                 x,
        int                 z,
        unsigned int        w,
        unsigned int        h,
        const BiomeFilter * filter
        )
{
    Layer *l;
    int *ids;
    int ret, err;
    int memsiz, mem1x1;

    if (filter->flags & BF_APPROX) // TODO: protoCheck for 1.6-
    {
        l = entry;

        int i, j;
        int bx = x * l->scale;
        int bz = z * l->scale;
        int bw = w * l->scale;
        int bh = h * l->scale;
        int x0, z0, x1, z1;
        uint64_t ss, cs;
        uint64_t potential, required;

        int specialcnt = filter->specialCnt;
        if (specialcnt > 0)
        {
            l = &g->layers[L_SPECIAL_1024];
            x0 = (bx) / l->scale; if (x < 0) x0--;
            z0 = (bz) / l->scale; if (z < 0) z0--;
            x1 = (bx + bw) / l->scale; if (x+(int)w >= 0) x1++;
            z1 = (bz + bh) / l->scale; if (z+(int)h >= 0) z1++;
            ss = getStartSeed(seed, l->layerSalt);

            for (j = z0; j <= z1; j++)
            {
                for (i = x0; i <= x1; i++)
                {
                    cs = getChunkSeed(ss, i, j);
                    if (mcFirstIsZero(cs, 13))
                        specialcnt--;
                }
            }
            if (specialcnt > 0)
                return 0;
        }

        l = &g->layers[L_BIOME_256];
        x0 = bx / l->scale; if (x < 0) x0--;
        z0 = bz / l->scale; if (z < 0) z0--;
        x1 = (bx + bw) / l->scale; if (x+(int)w >= 0) x1++;
        z1 = (bz + bh) / l->scale; if (z+(int)h >= 0) z1++;

        if (filter->majorToFind & (1ULL << mushroom_fields))
        {
            ss = getStartSeed(seed, g->layers[L_MUSHROOM_256].layerSalt);

            for (j = z0; j <= z1; j++)
            {
                for (i = x0; i <= x1; i++)
                {
                    cs = getChunkSeed(ss, i, j);
                    if (mcFirstIsZero(cs, 100))
                        goto L_has_proto_mushroom;
                }
            }
            return 0;
        }
L_has_proto_mushroom:

        potential = 0;
        required = filter->majorToFind & (
                (1ULL << badlands_plateau) | (1ULL << wooded_badlands_plateau) |
                (1ULL << desert) | (1ULL << savanna) | (1ULL << plains) |
                (1ULL << forest) | (1ULL << dark_forest) | (1ULL << mountains) |
                (1ULL << birch_forest) | (1ULL << swamp));

        ss = getStartSeed(seed, l->layerSalt);

        for (j = z0; j <= z1; j++)
        {
            for (i = x0; i <= x1; i++)
            {
                cs = getChunkSeed(ss, i, j);
                int cs6 = mcFirstInt(cs, 6);
                int cs3 = mcFirstInt(cs, 3);
                int cs4 = mcFirstInt(cs, 4);

                if (cs3) potential |= (1ULL << badlands_plateau);
                else potential |= (1ULL << wooded_badlands_plateau);

                switch (cs6)
                {
                case 0: potential |= (1ULL << desert) | (1ULL << forest); break;
                case 1: potential |= (1ULL << desert) | (1ULL << dark_forest); break;
                case 2: potential |= (1ULL << desert) | (1ULL << mountains); break;
                case 3: potential |= (1ULL << savanna) | (1ULL << plains); break;
                case 4: potential |= (1ULL << savanna) | (1ULL << birch_forest); break;
                case 5: potential |= (1ULL << plains) | (1ULL << swamp); break;
                }

                if (cs4 == 3) potential |= (1ULL << snowy_taiga);
                else potential |= (1ULL << snowy_tundra);
            }
        }

        if ((potential & required) ^ required)
            return 0;
    }

    l = g->layers;
    if (cache)
    {
        memsiz = 0;
        ids = cache;
    }
    else
    {
        memsiz = getMinLayerCacheSize(entry, w, h);
        ids = (int*) calloc(memsiz, sizeof(int));
    }

    if ((filter->biomeToExcl | filter->biomeToExclM) && w*h > 1)
    {
        err = 0;
        if (memsiz == 0)
            memsiz = getMinLayerCacheSize(entry, w, h);
        mem1x1 = getMinLayerCacheSize(entry, 1, 1);
        if (mem1x1 * 2 < memsiz)
        {
            setLayerSeed(entry, seed);
            err = testExclusion(entry, ids, x+w/2, z+h/2, filter);
        }
        if (mem1x1 * 5 < memsiz)
        {
            if (!err) err = testExclusion(entry, ids, x,     z,     filter);
            if (!err) err = testExclusion(entry, ids, x+w-1, z+h-1, filter);
            if (!err) err = testExclusion(entry, ids, x,     z+h-1, filter);
            if (!err) err = testExclusion(entry, ids, x+w-1, z,     filter);
        }
        if (err)
        {
            if (cache == NULL)
                free(ids);
            return 0;
        }
    }

    filter_data_t fd[9];
    swapMap(fd+0, filter, l+L_OCEAN_MIX_4,    mapFilterOceanMix);
    swapMap(fd+1, filter, l+L_RIVER_MIX_4,    mapFilterRiverMix);
    swapMap(fd+2, filter, l+L_SHORE_16,       mapFilterShore);
    swapMap(fd+3, filter, l+L_SUNFLOWER_64,   mapFilterRareBiome);
    swapMap(fd+4, filter, l+L_BIOME_EDGE_64,  mapFilterBiomeEdge);
    swapMap(fd+5, filter, l+L_OCEAN_TEMP_256, mapFilterOceanTemp);
    swapMap(fd+6, filter, l+L_BIOME_256,      mapFilterBiome);
    swapMap(fd+7, filter, l+L_MUSHROOM_256,   mapFilterMushroom);
    swapMap(fd+8, filter, l+L_SPECIAL_1024,   mapFilterSpecial);

    ret = 0;
    setLayerSeed(entry, seed);
    err = entry->getMap(entry, ids, x, z, w, h);
    if (err == 0)
    {
        uint64_t b = 0, m = 0;
        unsigned int i;
        for (i = 0; i < w*h; i++)
        {
            int id = ids[i];
            if (id < 128) b |= (1ULL << id);
            else m |= (1ULL << (id-128));
        }

        int match_exc = (filter->biomeToExcl|filter->biomeToExclM) == 0;
        int match_any = (filter->biomeToPick|filter->biomeToPickM) == 0;
        int match_req = (filter->biomeToFind|filter->biomeToFindM) == 0;
        match_exc |= ((b & filter->biomeToExcl) || (m & filter->biomeToExclM)) == 0;
        match_any |= ((b & filter->biomeToPick) || (m & filter->biomeToPickM));
        match_req |= ((b & filter->biomeToFind)  == filter->biomeToFind &&
                      (m & filter->biomeToFindM) == filter->biomeToFindM);
        if (match_exc && match_any && match_req)
            ret = 1;
    }
    else if (err == M_STOP)
    {   // biome requirements not met
        ret = 0;
    }
    else if (err == M_DONE)
    {   // exclusion biomes cannot generate
        ret = 2;
    }

    restoreMap(fd+8, l+L_SPECIAL_1024);
    restoreMap(fd+7, l+L_MUSHROOM_256);
    restoreMap(fd+6, l+L_BIOME_256);
    restoreMap(fd+5, l+L_OCEAN_TEMP_256);
    restoreMap(fd+4, l+L_BIOME_EDGE_64);
    restoreMap(fd+3, l+L_SUNFLOWER_64);
    restoreMap(fd+2, l+L_SHORE_16);
    restoreMap(fd+1, l+L_RIVER_MIX_4);
    restoreMap(fd+0, l+L_OCEAN_MIX_4);

    if (cache == NULL)
        free(ids);

    return ret;
}